

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVec2 IVar1;
  ImGuiNavLayer IVar2;
  uint move_flags;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var3;
  ImGuiViewportP *pIVar4;
  char *text;
  ImGuiContext *pIVar5;
  ImGuiContext *ctx;
  ImGuiContext *pIVar6;
  bool bVar7;
  int iVar8;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar9;
  char *pcVar10;
  byte bVar11;
  ImGuiContext *g;
  byte bVar12;
  int iVar13;
  ImGuiDir clip_dir;
  char *label;
  int i;
  ulong uVar14;
  float fVar15;
  ImVec2 IVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  ImVec2 local_38;
  
  ctx = GImGui;
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  local_38 = in_RAX;
  CallContextHooks(GImGui,ImGuiContextHookType_EndFramePre);
  pIVar5 = GImGui;
  iVar8 = (GImGui->CurrentWindowStack).Size;
  if (1 < iVar8) {
    while (1 < iVar8) {
      End();
      iVar8 = (pIVar5->CurrentWindowStack).Size;
    }
  }
  p_Var3 = (ctx->IO).SetPlatformImeDataFn;
  if ((p_Var3 != (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) &&
     (auVar19[0] = -((ctx->PlatformImeDataPrev).WantVisible == (ctx->PlatformImeData).WantVisible),
     auVar19[1] = -((ctx->PlatformImeDataPrev).field_0x1 == (ctx->PlatformImeData).field_0x1),
     auVar19[2] = -((ctx->PlatformImeDataPrev).field_0x2 == (ctx->PlatformImeData).field_0x2),
     auVar19[3] = -((ctx->PlatformImeDataPrev).field_0x3 == (ctx->PlatformImeData).field_0x3),
     auVar19[4] = -(*(char *)&(ctx->PlatformImeDataPrev).InputPos.x ==
                   *(char *)&(ctx->PlatformImeData).InputPos.x),
     auVar19[5] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 1) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 1)),
     auVar19[6] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 2) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 2)),
     auVar19[7] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.x + 3) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.x + 3)),
     auVar19[8] = -(*(char *)&(ctx->PlatformImeDataPrev).InputPos.y ==
                   *(char *)&(ctx->PlatformImeData).InputPos.y),
     auVar19[9] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 1) ==
                   *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 1)),
     auVar19[10] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 2) ==
                    *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 2)),
     auVar19[0xb] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputPos.y + 3) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputPos.y + 3)),
     auVar19[0xc] = -(*(char *)&(ctx->PlatformImeDataPrev).InputLineHeight ==
                     *(char *)&(ctx->PlatformImeData).InputLineHeight),
     auVar19[0xd] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 1) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 1)),
     auVar19[0xe] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 2) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 2)),
     auVar19[0xf] = -(*(char *)((long)&(ctx->PlatformImeDataPrev).InputLineHeight + 3) ==
                     *(char *)((long)&(ctx->PlatformImeData).InputLineHeight + 3)),
     (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf)
     != 0xffff)) {
    (*p_Var3)(&(*(GImGui->Viewports).Data)->super_ImGuiViewport,&ctx->PlatformImeData);
  }
  ctx->WithinFrameScopeWithImplicitWindow = false;
  pIVar9 = ctx->CurrentWindow;
  if ((pIVar9 != (ImGuiWindow *)0x0) && (pIVar9->WriteAccessed == false)) {
    pIVar9->Active = false;
  }
  End();
  pIVar5 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar9 = FindWindowByName("###NavWindowingList");
      pIVar5->NavWindowingListWindow = pIVar9;
    }
    pIVar4 = *(pIVar5->Viewports).Data;
    IVar1 = (pIVar4->super_ImGuiViewport).Size;
    IVar16.x = IVar1.x * 0.2;
    IVar16.y = IVar1.y * 0.2;
    (pIVar5->NextWindowData).SizeConstraintRect.Min = IVar16;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar5->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar1 = (pIVar4->super_ImGuiViewport).Pos;
    IVar16 = (pIVar4->super_ImGuiViewport).Size;
    (pIVar5->NextWindowData).Flags = (pIVar5->NextWindowData).Flags | 0x11;
    (pIVar5->NextWindowData).PosVal.x = IVar16.x * 0.5 + IVar1.x;
    (pIVar5->NextWindowData).PosVal.y = IVar16.y * 0.5 + IVar1.y;
    (pIVar5->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar5->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar5->NextWindowData).PosCond = 1;
    IVar1 = (pIVar5->Style).WindowPadding;
    fVar17 = IVar1.x;
    fVar20 = IVar1.y;
    local_38.x = fVar17 + fVar17;
    local_38.y = fVar20 + fVar20;
    PushStyleVar(2,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    for (uVar14 = (ulong)(uint)(pIVar5->WindowsFocusOrder).Size; 0 < (int)uVar14;
        uVar14 = uVar14 - 1) {
      pIVar9 = (pIVar5->WindowsFocusOrder).Data[uVar14 - 1];
      bVar7 = IsWindowNavFocusable(pIVar9);
      if (bVar7) {
        text = pIVar9->Name;
        pcVar10 = FindRenderedTextEnd(text,(char *)0x0);
        label = text;
        if (text == pcVar10) {
          label = "(Popup)";
          if (((uint)pIVar9->Flags >> 0x1a & 1) == 0) {
            if (((uint)pIVar9->Flags >> 10 & 1) != 0) {
              iVar8 = strcmp(text,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar8 == 0) goto LAB_001121e2;
            }
            label = "(Untitled)";
          }
        }
LAB_001121e2:
        local_38.x = 0.0;
        local_38.y = 0.0;
        Selectable(label,pIVar5->NavWindowingTarget == pIVar9,0,&local_38);
      }
    }
    End();
    PopStyleVar(1);
  }
  if (((pIVar5->NavWindow != (ImGuiWindow *)0x0) &&
      (bVar7 = NavMoveRequestButNoResultYet(), pIVar6 = GImGui, bVar7)) &&
     (-1 < (char)pIVar5->NavMoveFlags && (pIVar5->NavMoveFlags & 0xfU) != 0)) {
    pIVar9 = GImGui->NavWindow;
    IVar2 = GImGui->NavLayer;
    fVar20 = pIVar9->NavRectRel[IVar2].Min.x;
    fVar17 = pIVar9->NavRectRel[IVar2].Min.y;
    fVar15 = pIVar9->NavRectRel[IVar2].Max.x;
    fVar18 = pIVar9->NavRectRel[IVar2].Max.y;
    iVar8 = GImGui->NavMoveDir;
    move_flags = GImGui->NavMoveFlags;
    if (iVar8 == 0) {
      iVar13 = 0;
      clip_dir = 0;
      if ((move_flags & 5) == 0) {
        bVar7 = false;
      }
      else {
        fVar20 = (pIVar9->ContentSize).x + (pIVar9->WindowPadding).x;
        bVar7 = true;
        if ((move_flags & 4) == 0) goto LAB_0011230f;
        fVar15 = fVar18 - fVar17;
        fVar17 = fVar17 - fVar15;
        fVar18 = fVar18 - fVar15;
        clip_dir = 2;
        fVar15 = fVar20;
      }
    }
    else if (iVar8 == 1 && (move_flags & 5) != 0) {
      fVar20 = -(pIVar9->WindowPadding).x;
      if ((move_flags & 4) == 0) {
        iVar13 = 1;
      }
      else {
        fVar15 = fVar18 - fVar17;
        fVar17 = fVar17 + fVar15;
        fVar18 = fVar18 + fVar15;
        iVar13 = 3;
      }
LAB_0011230f:
      bVar7 = true;
      clip_dir = iVar13;
      fVar15 = fVar20;
    }
    else {
      bVar7 = false;
      clip_dir = iVar8;
    }
    if ((move_flags & 10) == 0 || iVar8 != 2) {
      if (iVar8 == 3 && (move_flags & 10) != 0) {
        fVar18 = -(pIVar9->WindowPadding).y;
        fVar17 = fVar18;
        if ((move_flags & 8) != 0) {
          fVar21 = fVar15 - fVar20;
          fVar20 = fVar20 + fVar21;
          fVar15 = fVar15 + fVar21;
          clip_dir = 1;
        }
      }
      else if (!bVar7) goto LAB_001123b4;
    }
    else {
      fVar18 = (pIVar9->ContentSize).y + (pIVar9->WindowPadding).y;
      fVar17 = fVar18;
      if ((move_flags & 8) != 0) {
        fVar21 = fVar15 - fVar20;
        fVar20 = fVar20 - fVar21;
        fVar15 = fVar15 - fVar21;
        clip_dir = 0;
      }
    }
    pIVar9->NavRectRel[IVar2].Min.x = fVar20;
    pIVar9->NavRectRel[IVar2].Min.y = fVar17;
    pIVar9->NavRectRel[IVar2].Max.x = fVar15;
    pIVar9->NavRectRel[IVar2].Max.y = fVar18;
    NavMoveRequestForward(iVar8,clip_dir,move_flags,pIVar6->NavMoveScrollFlags);
  }
LAB_001123b4:
  bVar11 = ctx->DragDropActive;
  iVar8 = ctx->FrameCount;
  if ((bool)bVar11 != true) goto LAB_00112418;
  if ((ctx->DragDropPayload).DataFrameCount + 1 < iVar8) {
    if ((ctx->DragDropSourceFlags & 0x20) == 0) {
      bVar12 = (GImGui->IO).MouseDown[ctx->DragDropMouseButton] ^ 1;
      goto LAB_001123fe;
    }
  }
  else {
    bVar12 = 0;
LAB_001123fe:
    if ((bVar12 == 0) && ((ctx->DragDropPayload).Delivery == false)) goto LAB_00112418;
  }
  ClearDragDrop();
  bVar11 = ctx->DragDropActive;
  iVar8 = ctx->FrameCount;
LAB_00112418:
  if ((((bVar11 & 1) != 0) && (ctx->DragDropSourceFrameCount < iVar8)) &&
     ((ctx->DragDropSourceFlags & 1) == 0)) {
    ctx->DragDropWithinSource = true;
    SetTooltip("...");
    ctx->DragDropWithinSource = false;
    iVar8 = ctx->FrameCount;
  }
  ctx->WithinFrameScope = false;
  ctx->FrameCountEnded = iVar8;
  UpdateMouseMovingWindowEndFrame();
  this = &ctx->WindowsTempSortBuffer;
  ImVector<ImGuiWindow_*>::resize(this,0);
  ImVector<ImGuiWindow_*>::reserve(this,(ctx->Windows).Size);
  for (uVar14 = 0; uVar14 != (uint)(ctx->Windows).Size; uVar14 = uVar14 + 1) {
    pIVar9 = (ctx->Windows).Data[uVar14];
    if ((pIVar9->Active != true) || ((pIVar9->Flags & 0x1000000) == 0)) {
      AddWindowToSortBuffer(this,pIVar9);
    }
  }
  ImVector<ImGuiWindow_*>::swap(&ctx->Windows,this);
  (ctx->IO).MetricsActiveWindows = ctx->WindowsActiveCount;
  ((ctx->IO).Fonts)->Locked = false;
  (ctx->IO).MouseWheel = 0.0;
  (ctx->IO).MouseWheelH = 0.0;
  ImVector<unsigned_short>::resize(&(ctx->IO).InputQueueCharacters,0);
  (ctx->IO).NavInputs[0x10] = 0.0;
  (ctx->IO).NavInputs[0x11] = 0.0;
  (ctx->IO).NavInputs[0x12] = 0.0;
  (ctx->IO).NavInputs[0x13] = 0.0;
  (ctx->IO).NavInputs[0xc] = 0.0;
  (ctx->IO).NavInputs[0xd] = 0.0;
  (ctx->IO).NavInputs[0xe] = 0.0;
  (ctx->IO).NavInputs[0xf] = 0.0;
  (ctx->IO).NavInputs[8] = 0.0;
  (ctx->IO).NavInputs[9] = 0.0;
  (ctx->IO).NavInputs[10] = 0.0;
  (ctx->IO).NavInputs[0xb] = 0.0;
  (ctx->IO).NavInputs[4] = 0.0;
  (ctx->IO).NavInputs[5] = 0.0;
  (ctx->IO).NavInputs[6] = 0.0;
  (ctx->IO).NavInputs[7] = 0.0;
  (ctx->IO).NavInputs[0] = 0.0;
  (ctx->IO).NavInputs[1] = 0.0;
  (ctx->IO).NavInputs[2] = 0.0;
  (ctx->IO).NavInputs[3] = 0.0;
  CallContextHooks(ctx,ImGuiContextHookType_EndFramePost);
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
        g.IO.SetPlatformImeDataFn(GetMainViewport(), &g.PlatformImeData);

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}